

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

ParameterError data_urlencode(GlobalConfig *global,char *nextarg,char **postp,size_t *lenp)

{
  int iVar1;
  ParameterError PVar2;
  CURLcode CVar3;
  char *pcVar4;
  FILE *__stream;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  char cVar8;
  long lVar9;
  size_t len;
  bool bVar10;
  char *postdata;
  size_t size;
  dynbuf dyn;
  char *local_68;
  size_t local_60;
  size_t *local_58;
  dynbuf local_50;
  
  local_58 = lenp;
  pcVar4 = strchr(nextarg,0x3d);
  local_68 = (char *)0x0;
  local_60 = 0;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = strchr(nextarg,0x40);
  }
  if (pcVar4 == (char *)0x0) {
    len = 0;
    bVar10 = false;
    pcVar4 = nextarg;
  }
  else {
    len = (long)pcVar4 - (long)nextarg;
    bVar10 = *pcVar4 == '@';
    pcVar4 = pcVar4 + 1;
  }
  if (bVar10) {
    iVar1 = strcmp("-",pcVar4);
    __stream = _stdin;
    if ((iVar1 == 0) || (__stream = fopen64(pcVar4,"rb"), __stream != (FILE *)0x0)) {
      PVar2 = file2memory(&local_68,&local_60,(FILE *)__stream);
      if ((__stream != (FILE *)0x0) && (__stream != _stdin)) {
        fclose(__stream);
      }
      bVar10 = PVar2 == PARAM_OK;
    }
    else {
      bVar10 = false;
      errorf(global,"Failed to open %s",pcVar4);
      PVar2 = PARAM_READ_ERROR;
    }
    if (!bVar10) {
      return PVar2;
    }
  }
  else {
    PVar2 = getstr(&local_68,pcVar4,true);
    if (PVar2 != PARAM_OK) {
      return PVar2;
    }
    local_60 = strlen(local_68);
    PVar2 = PARAM_OK;
  }
  if (local_68 == (char *)0x0) {
    local_68 = strdup("");
    if (local_68 == (char *)0x0) {
      return PARAM_NO_MEM;
    }
    local_60 = 0;
    goto LAB_00113968;
  }
  bVar10 = false;
  pcVar4 = (char *)curl_easy_escape(0,local_68,local_60 & 0xffffffff);
  free(local_68);
  local_68 = (char *)0x0;
  if (pcVar4 == (char *)0x0) {
    PVar2 = PARAM_NO_MEM;
  }
  else {
    sVar5 = strlen(pcVar4);
    uVar6 = 0;
    if (sVar5 != 0) {
      uVar7 = 0;
      do {
        cVar8 = pcVar4[uVar7];
        if (((cVar8 == '%') && (pcVar4[uVar7 + 1] == '2')) && (pcVar4[uVar7 + 2] == '0')) {
          lVar9 = 3;
          cVar8 = '+';
LAB_001138a1:
          pcVar4[uVar6] = cVar8;
        }
        else {
          lVar9 = 1;
          if (uVar6 != uVar7) goto LAB_001138a1;
        }
        uVar7 = uVar7 + lVar9;
        uVar6 = uVar6 + 1;
      } while (uVar7 < sVar5);
    }
    pcVar4[uVar6] = '\0';
    if (len == 0) {
      local_60 = strlen(pcVar4);
    }
    else {
      curlx_dyn_init(&local_50,0x1f400000);
      CVar3 = curlx_dyn_addn(&local_50,nextarg,len);
      if (((CVar3 == CURLE_OK) && (CVar3 = curlx_dyn_addn(&local_50,"=",1), CVar3 == CURLE_OK)) &&
         (CVar3 = curlx_dyn_add(&local_50,pcVar4), CVar3 == CURLE_OK)) {
        curl_free(pcVar4);
        pcVar4 = curlx_dyn_ptr(&local_50);
        local_60 = curlx_dyn_len(&local_50);
        bVar10 = true;
      }
      else {
        curl_free(pcVar4);
        PVar2 = PARAM_NO_MEM;
        bVar10 = false;
      }
      if (!bVar10) {
        bVar10 = false;
        goto LAB_00113964;
      }
    }
    bVar10 = true;
    local_68 = pcVar4;
  }
LAB_00113964:
  if (!bVar10) {
    return PVar2;
  }
LAB_00113968:
  *postp = local_68;
  *local_58 = local_60;
  return PARAM_OK;
}

Assistant:

static ParameterError data_urlencode(struct GlobalConfig *global,
                                     const char *nextarg,
                                     char **postp,
                                     size_t *lenp)
{
  /* [name]=[content], we encode the content part only
   * [name]@[filename]
   *
   * Case 2: we first load the file using that name and then encode
   * the content.
   */
  ParameterError err;
  const char *p = strchr(nextarg, '=');
  size_t nlen;
  char is_file;
  char *postdata = NULL;
  size_t size = 0;
  if(!p)
    /* there was no '=' letter, check for a '@' instead */
    p = strchr(nextarg, '@');
  if(p) {
    nlen = p - nextarg; /* length of the name part */
    is_file = *p++; /* pass the separator */
  }
  else {
    /* neither @ nor =, so no name and it is not a file */
    nlen = 0;
    is_file = 0;
    p = nextarg;
  }
  if('@' == is_file) {
    FILE *file;
    /* a '@' letter, it means that a filename or - (stdin) follows */
    if(!strcmp("-", p)) {
      file = stdin;
      CURL_SET_BINMODE(stdin);
    }
    else {
      file = fopen(p, "rb");
      if(!file) {
        errorf(global, "Failed to open %s", p);
        return PARAM_READ_ERROR;
      }
    }

    err = file2memory(&postdata, &size, file);

    if(file && (file != stdin))
      fclose(file);
    if(err)
      return err;
  }
  else {
    err = getstr(&postdata, p, ALLOW_BLANK);
    if(err)
      goto error;
    size = strlen(postdata);
  }

  if(!postdata) {
    /* no data from the file, point to a zero byte string to make this
       get sent as a POST anyway */
    postdata = strdup("");
    if(!postdata)
      return PARAM_NO_MEM;
    size = 0;
  }
  else {
    char *enc = curl_easy_escape(NULL, postdata, (int)size);
    curlx_safefree(postdata); /* no matter if it worked or not */
    if(enc) {
      char *n;
      replace_url_encoded_space_by_plus(enc);
      if(nlen > 0) { /* only append '=' if we have a name */
        struct curlx_dynbuf dyn;
        curlx_dyn_init(&dyn, MAX_DATAURLENCODE);
        if(curlx_dyn_addn(&dyn, nextarg, nlen) ||
           curlx_dyn_addn(&dyn, "=", 1) ||
           curlx_dyn_add(&dyn, enc)) {
          curl_free(enc);
          return PARAM_NO_MEM;
        }
        curl_free(enc);
        n = curlx_dyn_ptr(&dyn);
        size = curlx_dyn_len(&dyn);
      }
      else {
        n = enc;
        size = strlen(n);
      }
      postdata = n;
    }
    else
      return PARAM_NO_MEM;
  }
  *postp = postdata;
  *lenp = size;
  return PARAM_OK;
error:
  return err;
}